

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O3

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  int iVar1;
  unsigned_long numFrames;
  PaError PVar2;
  void *__dest;
  long lVar3;
  char *format;
  unsigned_long framesGot;
  int xrun;
  unsigned_long framesAvail;
  unsigned_long local_58;
  PaError local_50;
  int local_4c;
  undefined8 local_48;
  void *local_40;
  ulong local_38;
  
  lVar3 = *(long *)((long)s + 0x2c0);
  local_48 = *(undefined8 *)((long)s + 0x340);
  if (lVar3 == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4387\n"
                     );
    PVar2 = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    PVar2 = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      *(undefined8 *)((long)s + 0x280) = 0;
      PVar2 = -0x26fd;
    }
    __dest = buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      __dest = *(void **)((long)s + 0x2e8);
      memcpy(__dest,buffer,(long)*(int *)((long)s + 0x290) << 3);
      lVar3 = *(long *)((long)s + 0x2c0);
    }
    local_40 = __dest;
    iVar1 = snd_pcm_state(lVar3);
    if ((iVar1 == 2) && (iVar1 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar1 < 0)) {
      ReadStream_cold_1();
      PVar2 = -9999;
    }
    else if (frames != 0) {
      local_50 = PVar2;
      do {
        local_4c = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&local_38,&local_4c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4418\n"
          ;
LAB_0010e6cb:
          PaUtil_DebugPrint(format);
          PVar2 = paUtilErr_;
          break;
        }
        local_58 = local_38;
        if (frames <= local_38) {
          local_58 = frames;
        }
        paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&local_58,&local_4c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4421\n"
          ;
          goto LAB_0010e6cb;
        }
        if (local_58 != 0) {
          numFrames = PaUtil_CopyInput((PaUtilBufferProcessor *)((long)s + 0x68),&local_40,local_58)
          ;
          local_58 = numFrames;
          paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&local_4c);
          if (paUtilErr_ < 0) {
            format = 
            "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4425\n"
            ;
            goto LAB_0010e6cb;
          }
          frames = frames - numFrames;
        }
        PVar2 = local_50;
      } while (frames != 0);
    }
  }
  *(undefined8 *)((long)s + 0x340) = local_48;
  return PVar2;
}

Assistant:

static PaError ReadStream( PaStream* s,
                           void *buffer,
                           unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}